

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Log.cpp
# Opt level: O2

void Logger::Log(size_t level,string *msg)

{
  int iVar1;
  uint uVar2;
  long lVar3;
  tm *__tp;
  ostream *poVar4;
  time_t tt;
  char dateTime [28];
  
  if (logLevel <= level) {
    lVar3 = std::chrono::_V2::system_clock::now();
    tt = lVar3 / 1000000000;
    uVar2 = 4;
    if (level < 4) {
      uVar2 = (uint)level;
    }
    iVar1 = *(int *)(_ZL8CATEGORY_rel + (ulong)uVar2 * 4);
    __tp = localtime(&tt);
    strftime(dateTime,0x1c,"%FT%T%z ",__tp);
    poVar4 = std::operator<<((ostream *)&std::cerr,dateTime);
    poVar4 = std::operator<<(poVar4,_ZL8CATEGORY_rel + iVar1);
    poVar4 = std::operator<<(poVar4,(string *)msg);
    std::endl<char,std::char_traits<char>>(poVar4);
  }
  return;
}

Assistant:

void Logger::Log(const size_t level, const std::string& msg)
{
    if (level >= logLevel) {
        std::time_t tt = std::chrono::system_clock::to_time_t(std::chrono::system_clock::now());
        const auto category = CATEGORY[std::min(level, sizeof(CATEGORY) / sizeof(CATEGORY[0]))];
        char dateTime[28];

        //TODO use std::put_time() when available
        TIME_T_TO_STRING(dateTime, &tt);
        std::cerr << dateTime << category << msg << std::endl;
    }
}